

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

QMatchData * __thiscall
QUnsortedModelEngine::filter
          (QMatchData *__return_storage_ptr__,QUnsortedModelEngine *this,QString *part,
          QModelIndex *parent,int n)

{
  long lVar1;
  Data *pDVar2;
  QString part_00;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  int *piVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffec8;
  QIndexMapper local_110;
  QIndexMapper im;
  QArrayDataPointer<int> local_b8;
  QMatchData m;
  QMatchData hint;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hint.indices.v = false;
  hint.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  hint.indices.vector.d.d = (Data *)0x0;
  hint.indices.vector.d.ptr._0_4_ = 0;
  hint.indices.vector.d.ptr._4_4_ = 0;
  hint.indices.vector.d.size._0_4_ = 0;
  hint.indices.vector.d.size._4_4_ = 0;
  hint.indices.f = 0;
  hint.indices.t = -1;
  hint.exactMatchIndex = -1;
  hint.partial = false;
  hint._45_3_ = 0xaaaaaa;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (int *)0x0;
  local_b8.size = 0;
  im._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  im.vector.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  im.vector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  im._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  im.vector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QIndexMapper::QIndexMapper(&im,(QList<int> *)&local_b8);
  m.indices._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  m._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  m.indices.vector.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  m.indices.vector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  m.indices._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  m.indices.vector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QIndexMapper::QIndexMapper(&m.indices,&im);
  m.exactMatchIndex = -1;
  m.partial = true;
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  bVar3 = QCompletionEngine::lookupCache(&this->super_QCompletionEngine,part,parent,&m);
  if (bVar3) {
    bVar4 = m.partial;
LAB_005d2cb0:
    if ((bVar4 & 1) != 0) {
      if ((n != -1) || (m.exactMatchIndex != -1)) {
        if (m.indices.v == true) {
          iVar5 = (int)m.indices.vector.d.size;
        }
        else {
          iVar5 = (m.indices.t - m.indices.f) + 1;
        }
        if (n <= iVar5) goto LAB_005d2e6c;
      }
      iVar5 = (**(code **)(*plVar6 + 0x78))(plVar6,parent);
      piVar7 = (int *)(CONCAT44(hint.indices.vector.d.ptr._4_4_,hint.indices.vector.d.ptr._0_4_) +
                       CONCAT44(hint.indices.vector.d.size._4_4_,
                                (undefined4)hint.indices.vector.d.size) * 4 + -4);
      if (hint.indices.v == false) {
        piVar7 = &hint.indices.t;
      }
      local_110.vector.d.size._0_4_ = 0;
      local_110.vector.d.size._4_4_ = 0;
      local_110.f = *piVar7 + 1;
      local_110.v = false;
      local_110._1_7_ = 0xaaaaaaaaaaaaaa;
      local_110.vector.d.d = (Data *)0x0;
      local_110.vector.d.ptr._0_4_ = 0;
      local_110.vector.d.ptr._4_4_ = 0;
      if (n == -1) {
        iVar8 = -1;
      }
      else {
        if (m.indices.v == true) {
          iVar8 = (int)m.indices.vector.d.size;
        }
        else {
          iVar8 = (m.indices.t - m.indices.f) + 1;
        }
        iVar8 = n - iVar8;
      }
      local_110.t = iVar5 + -1;
      iVar8 = buildIndices(this,part,parent,iVar8,&local_110,&m);
      bVar3 = iVar5 + -1 == iVar8;
      goto LAB_005d2e58;
    }
  }
  else {
    bVar3 = QCompletionEngine::matchHint(&this->super_QCompletionEngine,part,parent,&hint);
    if (bVar3) {
      if ((hint.indices._0_8_ & 1) == 0) {
        if (hint.indices.f <= hint.indices.t) goto LAB_005d2d1e;
      }
      else if (CONCAT44(hint.indices.vector.d.size._4_4_,(undefined4)hint.indices.vector.d.size) !=
               0) goto LAB_005d2c6d;
      (__return_storage_ptr__->indices).v = false;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
      *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
      __return_storage_ptr__->partial = false;
      goto LAB_005d2ec5;
    }
    if ((hint.indices._0_8_ & 1) == 0) {
LAB_005d2d1e:
      if (hint.indices.f <= hint.indices.t) goto LAB_005d2c7c;
    }
    else {
LAB_005d2c6d:
      if (CONCAT44(hint.indices.vector.d.size._4_4_,(undefined4)hint.indices.vector.d.size) != 0) {
LAB_005d2c7c:
        buildIndices(this,part,parent,0x7fffffff,&hint.indices,&m);
        m.partial = hint.partial;
        bVar4 = hint.partial;
        goto LAB_005d2cb0;
      }
    }
    iVar5 = (**(code **)(*plVar6 + 0x78))(plVar6,parent);
    local_110.v = false;
    local_110._1_7_ = 0xaaaaaaaaaaaaaa;
    local_110.vector.d.d = (Data *)0x0;
    local_110.vector.d.ptr._0_4_ = 0;
    local_110.vector.d.ptr._4_4_ = 0;
    local_110.vector.d.size._0_4_ = 0;
    local_110.vector.d.size._4_4_ = 0;
    local_110.f = 0;
    local_110.t = iVar5 + -1;
    iVar8 = buildIndices(this,part,parent,n,&local_110,&m);
    bVar3 = iVar8 == iVar5 + -1;
LAB_005d2e58:
    m.partial = !bVar3;
    QArrayDataPointer<int>::~QArrayDataPointer(&local_110.vector.d);
  }
LAB_005d2e6c:
  pDVar2 = (part->d).d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  part_00.d.d._4_4_ = n;
  part_00.d.d._0_4_ = in_stack_fffffffffffffec8;
  part_00.d.ptr = (char16_t *)__return_storage_ptr__;
  part_00.d.size = (qsizetype)pDVar2;
  QCompletionEngine::saveInCache
            (&this->super_QCompletionEngine,part_00,(QModelIndex *)&stack0xfffffffffffffed8,
             (QMatchData *)parent);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffed8);
  QMatchData::QMatchData(__return_storage_ptr__,&m);
LAB_005d2ec5:
  QArrayDataPointer<int>::~QArrayDataPointer(&m.indices.vector.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&im.vector.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<int>::~QArrayDataPointer(&hint.indices.vector.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QMatchData QUnsortedModelEngine::filter(const QString& part, const QModelIndex& parent, int n)
{
    QMatchData hint;

    QList<int> v;
    QIndexMapper im(v);
    QMatchData m(im, -1, true);

    const QAbstractItemModel *model = c->proxy->sourceModel();
    bool foundInCache = lookupCache(part, parent, &m);

    if (!foundInCache) {
        if (matchHint(part, parent, &hint) && !hint.isValid())
            return QMatchData();
    }

    if (!foundInCache && !hint.isValid()) {
        const int lastRow = model->rowCount(parent) - 1;
        QIndexMapper all(0, lastRow);
        int lastIndex = buildIndices(part, parent, n, all, &m);
        m.partial = (lastIndex != lastRow);
    } else {
        if (!foundInCache) { // build from hint as much as we can
            buildIndices(part, parent, INT_MAX, hint.indices, &m);
            m.partial = hint.partial;
        }
        if (m.partial && ((n == -1 && m.exactMatchIndex == -1) || (m.indices.count() < n))) {
            // need more and have more
            const int lastRow = model->rowCount(parent) - 1;
            QIndexMapper rest(hint.indices.last() + 1, lastRow);
            int want = n == -1 ? -1 : n - m.indices.count();
            int lastIndex = buildIndices(part, parent, want, rest, &m);
            m.partial = (lastRow != lastIndex);
        }
    }

    saveInCache(part, parent, m);
    return m;
}